

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O1

bool __thiscall
SVGChart::PPlot::DrawXTick
          (PPlot *this,float inX,int inScreenY,bool inMajor,string *inFormatString,
          Painter *inPainter,PRect *outRect)

{
  int iVar1;
  undefined4 extraout_var;
  undefined7 in_register_00000011;
  long lVar2;
  int iVar3;
  float fVar4;
  undefined8 extraout_XMM0_Qa;
  undefined4 uVar5;
  char theBuf [128];
  char local_b8 [136];
  
  (*this->mXTrafo->_vptr_Trafo[2])();
  fVar4 = (float)extraout_XMM0_Qa;
  uVar5 = (undefined4)((ulong)extraout_XMM0_Qa >> 0x20);
  outRect->mX = (long)fVar4;
  outRect->mY = (long)inScreenY;
  outRect->mW = 0;
  if ((int)CONCAT71(in_register_00000011,inMajor) == 0) {
    iVar3 = (this->mXAxisSetup).mTickInfo.mMinorTickScreenSize;
    outRect->mH = (long)iVar3;
  }
  else {
    iVar3 = (this->mXAxisSetup).mTickInfo.mMajorTickScreenSize;
    snprintf(local_b8,0x80,(inFormatString->_M_dataplus)._M_p,(double)inX);
    iVar1 = (*inPainter->_vptr_Painter[9])(inPainter);
    lVar2 = (long)(this->mXAxisSetup).mTickInfo.mMinorTickScreenSize + (long)iVar3 +
            CONCAT44(extraout_var,iVar1);
    outRect->mH = lVar2;
    (*inPainter->_vptr_Painter[10])
              (inPainter,(ulong)(uint)(int)fVar4,(ulong)(uint)((int)lVar2 + inScreenY),local_b8);
    uVar5 = 0;
  }
  (**inPainter->_vptr_Painter)
            (CONCAT44(uVar5,fVar4),(float)inScreenY,fVar4,(float)(iVar3 + inScreenY),inPainter);
  return true;
}

Assistant:

bool PPlot::DrawXTick (float inX, int inScreenY, bool inMajor, const string &inFormatString, Painter &inPainter, PRect &outRect) const{
      char theBuf[128];
      int theTickSize;
      float theScreenX = mXTrafo->Transform(inX);
      outRect.mX = theScreenX;
      outRect.mY = inScreenY;
      outRect.mW = 0;
      if (inMajor) {
        theTickSize = mXAxisSetup.mTickInfo.mMajorTickScreenSize;
        snprintf (theBuf, 128, inFormatString.c_str (), inX);

        outRect.mH = inPainter.GetFontHeight ()+theTickSize + mXAxisSetup.mTickInfo.mMinorTickScreenSize;;
        inPainter.DrawText (theScreenX, inScreenY+outRect.mH, theBuf);
      }
      else {
        theTickSize = mXAxisSetup.mTickInfo.mMinorTickScreenSize;
        outRect.mH = theTickSize;
      }

      inPainter.DrawLine (theScreenX, inScreenY,theScreenX, inScreenY+theTickSize);
      return true;
    }